

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O1

int ssl_ciphersuite_match
              (mbedtls_ssl_context *ssl,int suite_id,mbedtls_ssl_ciphersuite_t **ciphersuite_info)

{
  uint uVar1;
  mbedtls_ssl_config *pmVar2;
  mbedtls_ssl_key_cert *pmVar3;
  int iVar4;
  mbedtls_pk_type_t mVar5;
  mbedtls_md_type_t mVar6;
  mbedtls_ssl_ciphersuite_t *info;
  mbedtls_ecp_curve_info **ppmVar7;
  mbedtls_ecp_curve_info *pmVar8;
  int iVar9;
  mbedtls_ssl_key_cert *pmVar10;
  mbedtls_ssl_key_cert *local_40;
  uint32_t local_34;
  
  info = mbedtls_ssl_ciphersuite_from_id(suite_id);
  if (info == (mbedtls_ssl_ciphersuite_t *)0x0) {
    iVar9 = -0x6c00;
  }
  else {
    iVar4 = 0;
    iVar9 = 0;
    if (((((info->min_minor_ver <= ssl->minor_ver) &&
          (iVar9 = iVar4, ssl->minor_ver <= info->max_minor_ver)) &&
         ((uVar1 = *(uint *)&ssl->conf->field_0x174, (uVar1 & 2) == 0 || ((info->flags & 4) == 0))))
        && ((((uVar1 & 0x40) == 0 || (info->cipher != MBEDTLS_CIPHER_ARC4_128)) &&
            ((iVar4 = mbedtls_ssl_ciphersuite_uses_ec(info), iVar4 == 0 ||
             ((ppmVar7 = ssl->handshake->curves, ppmVar7 != (mbedtls_ecp_curve_info **)0x0 &&
              (*ppmVar7 != (mbedtls_ecp_curve_info *)0x0)))))))) &&
       ((((iVar4 = mbedtls_ssl_ciphersuite_uses_psk(info), iVar4 == 0 ||
          (pmVar2 = ssl->conf,
          pmVar2->f_psk != (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0)) ||
         ((((pmVar2->psk != (uchar *)0x0 && (pmVar2->psk_identity != (uchar *)0x0)) &&
           (pmVar2->psk_identity_len != 0)) && (pmVar2->psk_len != 0)))) &&
        (((ssl->minor_ver != 3 ||
          (mVar5 = mbedtls_ssl_get_ciphersuite_sig_alg(info), mVar5 == MBEDTLS_PK_NONE)) ||
         (mVar6 = mbedtls_ssl_sig_hash_set_find(&ssl->handshake->hash_algs,mVar5),
         mVar6 != MBEDTLS_MD_NONE)))))) {
      mVar5 = mbedtls_ssl_get_ciphersuite_sig_pk_alg(info);
      pmVar10 = ssl->handshake->sni_key_cert;
      if (pmVar10 == (mbedtls_ssl_key_cert *)0x0) {
        pmVar10 = ssl->conf->key_cert;
      }
      if (mVar5 != MBEDTLS_PK_NONE) {
        if (pmVar10 == (mbedtls_ssl_key_cert *)0x0) {
          return 0;
        }
        local_40 = (mbedtls_ssl_key_cert *)0x0;
        do {
          iVar4 = mbedtls_pk_can_do(pmVar10->key,mVar5);
          if ((iVar4 != 0) &&
             (iVar4 = mbedtls_ssl_check_cert_usage(pmVar10->cert,info,1,&local_34), iVar4 == 0)) {
            if (mVar5 == MBEDTLS_PK_ECDSA) {
              ppmVar7 = ssl->handshake->curves;
              pmVar8 = *ppmVar7;
              if (pmVar8 != (mbedtls_ecp_curve_info *)0x0) {
                do {
                  ppmVar7 = ppmVar7 + 1;
                  if (pmVar8->grp_id == *pmVar10->key->pk_ctx) goto LAB_0011bd4b;
                  pmVar8 = *ppmVar7;
                } while (pmVar8 != (mbedtls_ecp_curve_info *)0x0);
              }
            }
            else {
LAB_0011bd4b:
              pmVar3 = pmVar10;
              if ((2 < ssl->minor_ver) || (pmVar10->cert->sig_md == MBEDTLS_MD_SHA1)) break;
              if (local_40 == (mbedtls_ssl_key_cert *)0x0) {
                local_40 = pmVar10;
              }
            }
          }
          pmVar10 = pmVar10->next;
          pmVar3 = local_40;
        } while (pmVar10 != (mbedtls_ssl_key_cert *)0x0);
        local_40 = pmVar3;
        if (local_40 == (mbedtls_ssl_key_cert *)0x0) {
          return 0;
        }
        ssl->handshake->key_cert = local_40;
      }
      *ciphersuite_info = info;
    }
  }
  return iVar9;
}

Assistant:

static int ssl_ciphersuite_match( mbedtls_ssl_context *ssl, int suite_id,
                                  const mbedtls_ssl_ciphersuite_t **ciphersuite_info )
{
    const mbedtls_ssl_ciphersuite_t *suite_info;

#if defined(MBEDTLS_SSL_PROTO_TLS1_2) && \
    defined(MBEDTLS_KEY_EXCHANGE__WITH_CERT__ENABLED)
    mbedtls_pk_type_t sig_type;
#endif

    suite_info = mbedtls_ssl_ciphersuite_from_id( suite_id );
    if( suite_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "trying ciphersuite: %s", suite_info->name ) );

    if( suite_info->min_minor_ver > ssl->minor_ver ||
        suite_info->max_minor_ver < ssl->minor_ver )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: version" ) );
        return( 0 );
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ( suite_info->flags & MBEDTLS_CIPHERSUITE_NODTLS ) )
        return( 0 );
#endif

#if defined(MBEDTLS_ARC4_C)
    if( ssl->conf->arc4_disabled == MBEDTLS_SSL_ARC4_DISABLED &&
            suite_info->cipher == MBEDTLS_CIPHER_ARC4_128 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: rc4" ) );
        return( 0 );
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if( suite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE &&
        ( ssl->handshake->cli_exts & MBEDTLS_TLS_EXT_ECJPAKE_KKPP_OK ) == 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: ecjpake "
                                    "not configured or ext missing" ) );
        return( 0 );
    }
#endif


#if defined(MBEDTLS_ECDH_C) || defined(MBEDTLS_ECDSA_C)
    if( mbedtls_ssl_ciphersuite_uses_ec( suite_info ) &&
        ( ssl->handshake->curves == NULL ||
          ssl->handshake->curves[0] == NULL ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: "
                            "no common elliptic curve" ) );
        return( 0 );
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    /* If the ciphersuite requires a pre-shared key and we don't
     * have one, skip it now rather than failing later */
    if( mbedtls_ssl_ciphersuite_uses_psk( suite_info ) &&
        ssl->conf->f_psk == NULL &&
        ( ssl->conf->psk == NULL || ssl->conf->psk_identity == NULL ||
          ssl->conf->psk_identity_len == 0 || ssl->conf->psk_len == 0 ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: no pre-shared key" ) );
        return( 0 );
    }
#endif

#if defined(MBEDTLS_SSL_PROTO_TLS1_2) && \
    defined(MBEDTLS_KEY_EXCHANGE__WITH_CERT__ENABLED)
    /* If the ciphersuite requires signing, check whether
     * a suitable hash algorithm is present. */
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        sig_type = mbedtls_ssl_get_ciphersuite_sig_alg( suite_info );
        if( sig_type != MBEDTLS_PK_NONE &&
            mbedtls_ssl_sig_hash_set_find( &ssl->handshake->hash_algs, sig_type ) == MBEDTLS_MD_NONE )
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: no suitable hash algorithm "
                                        "for signature algorithm %d", sig_type ) );
            return( 0 );
        }
    }

#endif /* MBEDTLS_SSL_PROTO_TLS1_2 &&
          MBEDTLS_KEY_EXCHANGE__WITH_CERT__ENABLED */

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    /*
     * Final check: if ciphersuite requires us to have a
     * certificate/key of a particular type:
     * - select the appropriate certificate if we have one, or
     * - try the next ciphersuite if we don't
     * This must be done last since we modify the key_cert list.
     */
    if( ssl_pick_cert( ssl, suite_info ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: "
                            "no suitable certificate" ) );
        return( 0 );
    }
#endif

    *ciphersuite_info = suite_info;
    return( 0 );
}